

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

size_t __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *sib)

{
  Siblings *sib_00;
  pointer bg;
  size_t sVar1;
  pointer ppVar2;
  size_t sVar3;
  const_iterator sh;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_28;
  
  local_28.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  sVar3 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  ppVar2 = (pointer)local_28.m_ptr + sVar3;
  while (local_28.m_ptr !=
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)ppVar2) {
    sib_00 = ((local_28.m_ptr)->second).children_;
    if (sib_00->parent_ == (local_28.m_ptr)->first) {
      sVar1 = num_simplices(this,sib_00);
      sVar3 = sVar3 + sVar1;
    }
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::operator++(&local_28);
  }
  return sVar3;
}

Assistant:

size_t num_simplices(const Siblings * sib) const {
    auto sib_begin = sib->members().begin();
    auto sib_end = sib->members().end();
    size_t simplices_number = sib->members().size();
    for (auto sh = sib_begin; sh != sib_end; ++sh) {
      if (has_children(sh)) {
        simplices_number += num_simplices(sh->second.children());
      }
    }
    return simplices_number;
  }